

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PCondFlushLine(TidyDocImpl *doc,uint indent)

{
  TidyPrintImpl *pprint;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  if ((doc->pprint).linelen != 0) {
    PFlushLineImpl(doc);
    prvTidyWriteChar(10,doc->docOut);
    (doc->pprint).line = (doc->pprint).line + 1;
  }
  if ((doc->pprint).indent[0].spaces != indent) {
    (doc->pprint).indent[0].spaces = indent;
  }
  return;
}

Assistant:

static void PCondFlushLine( TidyDocImpl* doc, uint indent )
{
    TidyPrintImpl* pprint = &doc->pprint;

    if ( pprint->linelen > 0 )
    {
         PFlushLineImpl( doc );

         TY_(WriteChar)( '\n', doc->docOut );
         pprint->line++;
    }

    /* Issue #390 - Whether chars to flush or not, set new indent */
    if ( pprint->indent[ 0 ].spaces != (int)indent )
    {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_INDENT)
        SPRTF("%s Indent from %d to %d\n", __FUNCTION__, pprint->indent[ 0 ].spaces, indent );
#endif  
         pprint->indent[ 0 ].spaces = indent;
    }
}